

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

uint __thiscall cmCTestGIT::GetGitVersion(cmCTestGIT *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  uint v [4];
  string version;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_version;
  string local_e0;
  OneLineParser version_out;
  string git;
  OutputLogger version_err;
  
  uVar3 = this->CurrentGitVersion;
  if (uVar3 == 0) {
    std::__cxx11::string::string
              ((string *)&git,
               (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool);
    std::__cxx11::string::string((string *)&version_out,(string *)&git);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version_out.super_LineParser.Line._M_string_length,"--version",
               (allocator<char> *)&version_err);
    __l._M_len = 2;
    __l._M_array = (iterator)&version_out;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&git_version,__l,(allocator_type *)&version);
    lVar4 = 0x20;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&version_out.super_LineParser.super_OutputParser._vptr_OutputParser + lVar4)
                );
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    version._M_dataplus._M_p = (pointer)&version.field_2;
    version._M_string_length = 0;
    version.field_2._M_local_buf[0] = '\0';
    OneLineParser::OneLineParser(&version_out,this,"version-out> ",&version);
    cmProcessTools::OutputLogger::OutputLogger
              (&version_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"version-err> ");
    v[0] = 0;
    v[1] = 0;
    v[2] = 0;
    v[3] = 0;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,&git_version,(OutputParser *)&version_out,
                                (OutputParser *)&version_err,&local_e0,Auto);
    if (bVar1) {
      iVar2 = __isoc99_sscanf(version._M_dataplus._M_p,"git version %u.%u.%u.%u",v,v + 1,v + 2,v + 3
                             );
      std::__cxx11::string::~string((string *)&local_e0);
      if (2 < iVar2) {
        this->CurrentGitVersion = v[2] * 1000 + v[1] * 100000 + v[0] * 10000000 + v[3];
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_e0);
    }
    cmProcessTools::LineParser::~LineParser(&version_err.super_LineParser);
    cmProcessTools::LineParser::~LineParser(&version_out.super_LineParser);
    std::__cxx11::string::~string((string *)&version);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&git_version);
    std::__cxx11::string::~string((string *)&git);
    uVar3 = this->CurrentGitVersion;
  }
  return uVar3;
}

Assistant:

unsigned int cmCTestGIT::GetGitVersion()
{
  if (!this->CurrentGitVersion) {
    std::string git = this->CommandLineTool;
    std::vector<std::string> git_version = { git, "--version" };
    std::string version;
    OneLineParser version_out(this, "version-out> ", version);
    OutputLogger version_err(this->Log, "version-err> ");
    unsigned int v[4] = { 0, 0, 0, 0 };
    if (this->RunChild(git_version, &version_out, &version_err) &&
        sscanf(version.c_str(), "git version %u.%u.%u.%u", &v[0], &v[1], &v[2],
               &v[3]) >= 3) {
      this->CurrentGitVersion = cmCTestGITVersion(v[0], v[1], v[2], v[3]);
    }
  }
  return this->CurrentGitVersion;
}